

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O3

bool __thiscall
Js::FunctionBody::AllocProfiledForInLoopCount(FunctionBody *this,ProfileId *profileId)

{
  uint32 uVar1;
  ProfileId PVar2;
  
  uVar1 = GetCountField(this,ProfiledForInLoopCount);
  PVar2 = (ProfileId)uVar1;
  if (PVar2 != 0xffff) {
    *profileId = PVar2;
    IncreaseCountField(this,ProfiledForInLoopCount);
  }
  return PVar2 != 0xffff;
}

Assistant:

bool AllocProfiledForInLoopCount(ProfileId* profileId)
        {
            ProfileId profiledForInLoopCount = this->GetProfiledForInLoopCount();
            if (profiledForInLoopCount != Constants::NoProfileId)
            {
                *profileId = profiledForInLoopCount;
                this->IncreaseCountField(CounterFields::ProfiledForInLoopCount);
                return true;
            }
            return false;
        }